

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>>
               (tuple<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *rangeBegin,
               tuple<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *patternTuple,undefined4 depth
               ,Context<const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Symbol_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::Sin_*,_bool,_const_mathiu::impl::Log_*,_bool,_const_mathiu::impl::Pi_*,_bool,_const_mathiu::impl::E_*,_bool,_const_mathiu::impl::Infinity_*,_bool>
                *context)

{
  bool bVar1;
  int *piVar2;
  __tuple_element_t<0UL,_tuple<Id<int>,_Id<int>_>_> *pattern;
  __tuple_element_t<1UL,_tuple<Id<int>,_Id<int>_>_> *pattern_00;
  bool local_41;
  long local_40;
  anon_class_16_2_afc162f5 func;
  Context<const_int_*,_bool,_const_mathiu::impl::Fraction_*,_bool,_const_mathiu::impl::Symbol_*,_bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_const_mathiu::impl::Power_*,_bool,_const_mathiu::impl::Sin_*,_bool,_const_mathiu::impl::Log_*,_bool,_const_mathiu::impl::Pi_*,_bool,_const_mathiu::impl::E_*,_bool,_const_mathiu::impl::Infinity_*,_bool>
  *context_local;
  tuple<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *ptStack_20;
  int32_t depth_local;
  tuple<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *patternTuple_local;
  int **rangeBegin_local;
  
  local_40 = (long)&context_local + 4;
  func.depth = (int32_t *)context;
  func.context = context;
  context_local._4_4_ = depth;
  ptStack_20 = patternTuple;
  patternTuple_local = rangeBegin;
  piVar2 = std::next<int_const*>
                     (*(int **)&(rangeBegin->
                                super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>
                                ).super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
                                super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.
                                mBlock.
                                super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                .
                                super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                      ,0);
  pattern = std::get<0ul,matchit::impl::Id<int>,matchit::impl::Id<int>>(ptStack_20);
  bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>>(int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,int,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>&,std::integer_sequence<unsigned_long,0ul,1ul>)
          ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,piVar2,pattern);
  local_41 = false;
  if (bVar1) {
    piVar2 = std::next<int_const*>
                       (*(int **)&(patternTuple_local->
                                  super__Tuple_impl<0UL,_matchit::impl::Id<int>,_matchit::impl::Id<int>_>
                                  ).super__Tuple_impl<1UL,_matchit::impl::Id<int>_>.
                                  super__Head_base<1UL,_matchit::impl::Id<int>,_false>._M_head_impl.
                                  mBlock.
                                  super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                                  .
                                  super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                        ,1);
    pattern_00 = std::get<1ul,matchit::impl::Id<int>,matchit::impl::Id<int>>(ptStack_20);
    local_41 = matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>>(int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,int,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>&,std::integer_sequence<unsigned_long,0ul,1ul>)
               ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_40,piVar2,pattern_00);
  }
  return local_41;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }